

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O3

int tnt_reply_len(char *buf,size_t size,size_t *len)

{
  byte bVar1;
  long *plVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t __n;
  
  if (size < 5) {
    sVar4 = 5 - size;
    uVar3 = 1;
  }
  else {
    bVar1 = *buf;
    uVar5 = (ulong)bVar1;
    if (mp_type_hint[uVar5] != MP_UINT) {
      return -1;
    }
    switch(bVar1) {
    case 0xcc:
      uVar5 = (ulong)(byte)buf[1];
      break;
    case 0xcd:
      uVar5 = (ulong)(ushort)(*(ushort *)(buf + 1) << 8 | *(ushort *)(buf + 1) >> 8);
      break;
    case 0xce:
      uVar3 = *(uint *)(buf + 1);
      uVar5 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                     uVar3 << 0x18);
      break;
    case 0xcf:
      uVar5 = *(ulong *)(buf + 1);
      uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18
              | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18
              | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
      break;
    default:
      if ((char)bVar1 < '\0') {
        tnt_reply_len_cold_1();
        plVar2 = *(long **)((long)buf + 8);
        memcpy((void *)size,(void *)(*(long *)buf + *plVar2),__n);
        *plVar2 = *plVar2 + __n;
        return (int)__n;
      }
    }
    uVar5 = uVar5 + 5;
    uVar3 = (uint)(size < uVar5);
    sVar4 = 0;
    if (size < uVar5) {
      sVar4 = size;
    }
    sVar4 = uVar5 - sVar4;
  }
  *len = sVar4;
  return uVar3;
}

Assistant:

static int
tnt_reply_len(const char *buf, size_t size, size_t *len)
{
	if (size < TNT_REPLY_IPROTO_HDR_SIZE) {
		*len = TNT_REPLY_IPROTO_HDR_SIZE - size;
		return 1;
	}
	const char *p = buf;
	if (mp_typeof(*p) != MP_UINT)
		return -1;
	size_t length = mp_decode_uint(&p);
	if (size < length + TNT_REPLY_IPROTO_HDR_SIZE) {
		*len = (length + TNT_REPLY_IPROTO_HDR_SIZE) - size;
		return 1;
	}
	*len = length + TNT_REPLY_IPROTO_HDR_SIZE;
	return 0;
}